

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::image::anon_unknown_0::BaseTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseTestInstance *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  VkCommandBuffer_s *commandBuffer;
  TestStatus *pTVar1;
  deUint32 queueFamilyIndex;
  DeviceInterface *deviceInterface;
  VkDevice device;
  const_iterator cVar2;
  VkDescriptorSetLayout descriptorSetLayout;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  IVec3 workSize;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Move<vk::Handle<(vk::HandleType)14>_> local_e8;
  Move<vk::Handle<(vk::HandleType)24>_> local_c8;
  Move<vk::VkCommandBuffer_s_*> local_a8;
  Move<vk::Handle<(vk::HandleType)18>_> local_88;
  VkQueue local_68;
  TestStatus *local_60;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  undefined4 extraout_var;
  
  local_60 = __return_storage_ptr__;
  (*(this->super_TestInstance)._vptr_TestInstance[9])(this);
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_68 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pcVar5 = "comp_fmt_unknown";
  if (this->m_declareImageFormatInShader != false) {
    pcVar5 = "comp";
  }
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  pcVar3 = pcVar5 + 0x10;
  if (this->m_declareImageFormatInShader != false) {
    pcVar3 = pcVar5 + 4;
  }
  local_108._0_8_ = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar5,pcVar3);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)local_108);
  ::vk::createShaderModule
            (&local_e8,deviceInterface,device,*(ProgramBinary **)(cVar2._M_node + 2),0);
  DStack_50.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_50.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_58.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_50.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ != &local_f8) {
    operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
  }
  descriptorSetLayout.m_internal._0_4_ = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  descriptorSetLayout.m_internal._4_4_ = extraout_var;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_108,deviceInterface,device,
                     descriptorSetLayout);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)local_f8._M_allocated_capacity;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_f8._8_8_;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = local_108._0_8_
  ;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_108._8_8_;
  makeComputePipeline(&local_88,deviceInterface,device,(VkPipelineLayout)local_108._0_8_,local_58);
  local_f8._M_allocated_capacity =
       (size_type)local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_f8._8_8_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_108._0_8_ = local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  local_108._8_8_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  ::vk::createCommandPool
            (&local_c8,deviceInterface,device,1,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            (&local_a8,deviceInterface,device,
             (VkCommandPool)
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer = local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface._4_4_,
                (uint)local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface);
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  beginCommandBuffer(deviceInterface,local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,commandBuffer,1,local_108._0_8_);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,commandBuffer);
  if (this->m_singleLayerBind == true) {
    local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface._0_4_ =
         (this->m_texture).m_layerSize.m_data[2];
    local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         *(VkCommandBuffer_s **)(this->m_texture).m_layerSize.m_data;
LAB_007280c5:
    uVar4 = (this->m_texture).m_numLayers;
    if ((int)uVar4 < 1) goto LAB_00728119;
  }
  else {
    Texture::size(&this->m_texture);
    uVar4 = 1;
    if ((this->m_singleLayerBind & 1U) != 0) goto LAB_007280c5;
  }
  uVar7 = 0;
  do {
    (*(this->super_TestInstance)._vptr_TestInstance[8])
              (this,commandBuffer,
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal,
               uVar7);
    if ((int)uVar7 != 0) {
      (*(this->super_TestInstance)._vptr_TestInstance[6])(this,commandBuffer);
    }
    (*deviceInterface->_vptr_DeviceInterface[0x5d])
              (deviceInterface,commandBuffer,
               (ulong)local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object & 0xffffffff,
               (ulong)local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object >> 0x20,
               (ulong)(uint)local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                            m_deviceIface);
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar4 != uVar6);
LAB_00728119:
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,commandBuffer);
  pTVar1 = local_60;
  endCommandBuffer(deviceInterface,commandBuffer);
  submitCommandsAndWait(deviceInterface,device,local_68,commandBuffer);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(pTVar1,this);
  if (commandBuffer != (VkCommandBuffer)0x0) {
    local_a8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = commandBuffer;
    (*(local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface,
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1)
    ;
  }
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkCommandPool)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_108 + 8),
               (VkPipeline)local_108._0_8_);
  }
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkPipelineLayout)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus BaseTestInstance::iterate (void)
{
	checkRequirements();

	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					device				= m_context.getDevice();
	const VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_declareImageFormatInShader ? "comp" : "comp_fmt_unknown"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_RESET_RELEASE_RESOURCES_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	commandBeforeCompute(*cmdBuffer);

	const tcu::IVec3 workSize = (m_singleLayerBind ? m_texture.layerSize() : m_texture.size());
	const int loopNumLayers = (m_singleLayerBind ? m_texture.numLayers() : 1);
	for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
	{
		commandBindDescriptorsForLayer(*cmdBuffer, *pipelineLayout, layerNdx);

		if (layerNdx > 0)
			commandBetweenShaderInvocations(*cmdBuffer);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
	}

	commandAfterCompute(*cmdBuffer);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return verifyResult();
}